

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

void __thiscall fasttext::Args::printDictionaryHelp(Args *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nThe following arguments for the dictionary are optional:\n",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -minCount           minimal number of word occurences [",0x39)
  ;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->minCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -minCountLabel      minimal number of label occurences [",0x3a);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->minCountLabel);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -wordNgrams         max length of word ngram [",0x30);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->wordNgrams);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -bucket             number of buckets [",0x29);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->bucket);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -minn               min length of char ngram [",0x30);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->minn);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -maxn               max length of char ngram [",0x30);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->maxn);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -t                  sampling threshold [",0x2a);
  poVar1 = std::ostream::_M_insert<double>(this->t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -label              labels prefix [",0x25);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->label)._M_dataplus._M_p,(this->label)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  return;
}

Assistant:

void Args::printDictionaryHelp() {
  std::cerr << "\nThe following arguments for the dictionary are optional:\n"
            << "  -minCount           minimal number of word occurences ["
            << minCount << "]\n"
            << "  -minCountLabel      minimal number of label occurences ["
            << minCountLabel << "]\n"
            << "  -wordNgrams         max length of word ngram [" << wordNgrams
            << "]\n"
            << "  -bucket             number of buckets [" << bucket << "]\n"
            << "  -minn               min length of char ngram [" << minn
            << "]\n"
            << "  -maxn               max length of char ngram [" << maxn
            << "]\n"
            << "  -t                  sampling threshold [" << t << "]\n"
            << "  -label              labels prefix [" << label << "]\n";
}